

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

void cimg_library::CImgDisplay::_render_resize<unsigned_char,unsigned_char>
               (uchar *ptrs,uint ws,uint hs,uchar *ptrd,uint wd,uint hd)

{
  void *pvVar1;
  uint *puVar2;
  uchar *puVar3;
  long lVar4;
  ulong __n;
  uint *puVar5;
  uint *puVar6;
  uint uVar7;
  float fVar8;
  float fVar9;
  
  __n = (ulong)wd;
  pvVar1 = operator_new__(__n * 4);
  puVar2 = (uint *)operator_new__((ulong)(hd + 1) << 2);
  fVar8 = 0.0;
  for (lVar4 = 0; wd != (uint)lVar4; lVar4 = lVar4 + 1) {
    fVar9 = (float)ws / (float)__n + fVar8;
    *(int *)((long)pvVar1 + lVar4 * 4) = (int)(long)fVar9 - (int)(long)fVar8;
    fVar8 = fVar9;
  }
  fVar8 = 0.0;
  for (lVar4 = 0; hd != (uint)lVar4; lVar4 = lVar4 + 1) {
    fVar9 = (float)hs / (float)hd + fVar8;
    puVar2[lVar4] = ((int)(long)fVar9 - (int)(long)fVar8) * ws;
    fVar8 = fVar9;
  }
  puVar2[lVar4] = 0;
  uVar7 = 0;
  puVar5 = puVar2;
  while (uVar7 < hd) {
    puVar3 = ptrs;
    for (lVar4 = 0; wd != (uint)lVar4; lVar4 = lVar4 + 1) {
      ptrd[lVar4] = *puVar3;
      puVar3 = puVar3 + *(uint *)((long)pvVar1 + lVar4 * 4);
    }
    ptrd = ptrd + lVar4;
    puVar6 = puVar5;
    while( true ) {
      uVar7 = uVar7 + 1;
      puVar5 = puVar6 + 1;
      if (((ulong)*puVar6 != 0) || (hd <= uVar7)) break;
      memcpy(ptrd,ptrd + -__n,__n);
      ptrd = ptrd + __n;
      puVar6 = puVar5;
    }
    ptrs = ptrs + *puVar6;
  }
  operator_delete__(pvVar1);
  operator_delete__(puVar2);
  return;
}

Assistant:

static void _render_resize(const T *ptrs, const unsigned int ws, const unsigned int hs,
                               t *ptrd, const unsigned int wd, const unsigned int hd) {
      unsigned int *const offx = new unsigned int[wd], *const offy = new unsigned int[hd+1], *poffx, *poffy;
      float s, curr, old;
      s = (float)ws/wd;
      poffx = offx; curr = 0; for (unsigned int x = 0; x<wd; ++x) { old = curr; curr+=s; *(poffx++) = (unsigned int)curr - (unsigned int)old; }
      s = (float)hs/hd;
      poffy = offy; curr = 0; for (unsigned int y = 0; y<hd; ++y) { old = curr; curr+=s; *(poffy++) = ws*((unsigned int)curr - (unsigned int)old); }
      *poffy = 0;
      poffy = offy;
      for (unsigned int y = 0; y<hd; ) {
        const T *ptr = ptrs;
        poffx = offx;
        for (unsigned int x = 0; x<wd; ++x) { *(ptrd++) = *ptr; ptr+=*(poffx++); }
        ++y;
        unsigned int dy = *(poffy++);
        for ( ; !dy && y<hd; std::memcpy(ptrd,ptrd - wd,sizeof(t)*wd), ++y, ptrd+=wd, dy = *(poffy++)) {}
        ptrs+=dy;
      }
      delete[] offx; delete[] offy;
    }